

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

bool jsoncons::jsonpath::detail::
     is_false<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *val)

{
  bool bVar1;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000028;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000040;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000058;
  string_view_type local_18;
  
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(in_RDI);
  if ((bVar1) &&
     (bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::empty
                        (in_stack_00000058), bVar1)) {
    return true;
  }
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(in_RDI);
  if ((bVar1) &&
     (bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::empty
                        (in_stack_00000058), bVar1)) {
    return true;
  }
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(in_RDI);
  if (bVar1) {
    local_18 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                         (in_stack_00000040);
    bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty(&local_18);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_bool(in_RDI);
  if ((bVar1) &&
     (bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool
                        (in_stack_00000028), !bVar1)) {
    return true;
  }
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null(in_RDI);
  return bVar1;
}

Assistant:

bool is_false(const Json& val)
    {
        return ((val.is_array() && val.empty()) ||
                 (val.is_object() && val.empty()) ||
                 (val.is_string() && val.as_string_view().empty()) ||
                 (val.is_bool() && !val.as_bool()) ||
                 val.is_null());
    }